

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall wabt::AST::Construct(AST *this,Expr *e)

{
  Label *pLVar1;
  Node *pNVar2;
  ExprType EVar3;
  IfExpr *ife;
  LabelType LVar4;
  Index IVar5;
  Arities AVar6;
  
  AVar6 = ModuleContext::GetExprArity(this->mc,e);
  EVar3 = e->type_;
  switch(EVar3) {
  case Block:
    Block<(wabt::ExprType)7>(this,(BlockExprBase<(wabt::ExprType)7> *)e,Block);
    return;
  case Br:
    pLVar1 = ModuleContext::GetLabel(this->mc,(Var *)(e + 1));
    LVar4 = pLVar1->label_type;
    EVar3 = Br;
    IVar5 = 0;
    goto LAB_001531d7;
  case BrIf:
    pLVar1 = ModuleContext::GetLabel(this->mc,(Var *)(e + 1));
    LVar4 = pLVar1->label_type;
    EVar3 = BrIf;
    IVar5 = 1;
LAB_001531d7:
    pNVar2 = InsertNode(this,Expr,EVar3,e,IVar5);
    (pNVar2->u).field_0.var_start = LVar4;
    return;
  default:
    IVar5 = AVar6.nargs;
    break;
  case GlobalGet:
    EVar3 = GlobalGet;
    IVar5 = 0;
    break;
  case GlobalSet:
    EVar3 = GlobalSet;
    IVar5 = 1;
    break;
  case If:
    this->value_stack_depth = this->value_stack_depth + -1;
    ModuleContext::BeginBlock(this->mc,Block,(Block *)(e + 1));
    Construct(this,(ExprList *)&e[3].loc.filename.size_,
              (Index)((ulong)((long)e[3].super_intrusive_list_base<wabt::Expr>.prev_ -
                             (long)e[3].super_intrusive_list_base<wabt::Expr>.next_) >> 2),false);
    if (e[4].loc.field_1.field_1.offset != 0) {
      Construct(this,(ExprList *)&e[4].loc,
                (Index)((ulong)((long)e[3].super_intrusive_list_base<wabt::Expr>.prev_ -
                               (long)e[3].super_intrusive_list_base<wabt::Expr>.next_) >> 2),false);
    }
    ModuleContext::EndBlock(this->mc);
    this->value_stack_depth = this->value_stack_depth + 1;
    IVar5 = 3 - (e[4].loc.field_1.field_1.offset == 0);
    EVar3 = If;
    break;
  case LocalGet:
    Get<(wabt::ExprType)22>(this,(VarExpr<(wabt::ExprType)22> *)e,true);
    return;
  case LocalSet:
    Set<(wabt::ExprType)23>(this,(VarExpr<(wabt::ExprType)23> *)e,true);
    return;
  case LocalTee:
    Set<(wabt::ExprType)24>(this,(VarExpr<(wabt::ExprType)24> *)e,true);
    if (this->value_stack_depth != 1) {
      return;
    }
    Get<(wabt::ExprType)24>(this,(VarExpr<(wabt::ExprType)24> *)e,true);
    return;
  case Loop:
    Block<(wabt::ExprType)25>(this,(BlockExprBase<(wabt::ExprType)25> *)e,Loop);
    return;
  }
  InsertNode(this,Expr,EVar3,e,IVar5);
  return;
}

Assistant:

void Construct(const Expr& e) {
    auto arity = mc.GetExprArity(e);
    switch (e.type()) {
      case ExprType::LocalGet: {
        Get(*cast<LocalGetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalGet: {
        Get(*cast<GlobalGetExpr>(&e), false);
        return;
      }
      case ExprType::LocalSet: {
        Set(*cast<LocalSetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalSet: {
        Set(*cast<GlobalSetExpr>(&e), false);
        return;
      }
      case ExprType::LocalTee: {
        auto& lt = *cast<LocalTeeExpr>(&e);
        Set(lt, true);
        if (value_stack_depth == 1) {  // Tee is the only thing on there.
          Get(lt, true);  // Now Set + Get instead.
        } else {
          // Things are above us on the stack so the Tee can't be eliminated.
          // The Set makes this work as a Tee when consumed by a parent.
        }
        return;
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(&e);
        value_stack_depth--;  // Condition.
        mc.BeginBlock(LabelType::Block, ife->true_);
        Construct(ife->true_.exprs, ife->true_.decl.GetNumResults(), false);
        if (!ife->false_.empty()) {
          Construct(ife->false_, ife->true_.decl.GetNumResults(), false);
        }
        mc.EndBlock();
        value_stack_depth++;  // Put Condition back.
        InsertNode(NodeType::Expr, ExprType::If, &e, ife->false_.empty() ? 2 : 3);
        return;
      }
      case ExprType::Block: {
        Block(*cast<BlockExpr>(&e), LabelType::Block);
        return;
      }
      case ExprType::Loop: {
        Block(*cast<LoopExpr>(&e), LabelType::Loop);
        return;
      }
      case ExprType::Br: {
        InsertNode(NodeType::Expr, ExprType::Br, &e, 0).u.lt =
            mc.GetLabel(cast<BrExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrIf: {
        InsertNode(NodeType::Expr, ExprType::BrIf, &e, 1).u.lt =
            mc.GetLabel(cast<BrIfExpr>(&e)->var)->label_type;
        return;
      }
      default: {
        InsertNode(NodeType::Expr, e.type(), &e, arity.nargs);
        return;
      }
    }
  }